

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionIDTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionIDTests::TestfromString_SessionStringMissingColon_SessionNotPopulated::
~TestfromString_SessionStringMissingColon_SessionNotPopulated
          (TestfromString_SessionStringMissingColon_SessionNotPopulated *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(fromString_SessionStringMissingColon_SessionNotPopulated)
{

  std::string sessionString = "FIX.4.2SENDER->TARGET";

  SessionID object;
  object.fromString(sessionString);

  CHECK_EQUAL("", object.getBeginString());
  CHECK_EQUAL("", object.getSenderCompID());
  CHECK_EQUAL("", object.getTargetCompID());
}